

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode copyStandardAttributes(UA_Node *node,UA_AddNodesItem *item,UA_NodeAttributes *attr)

{
  UA_StatusCode UVar1;
  UA_StatusCode UVar2;
  UA_StatusCode UVar3;
  UA_StatusCode UVar4;
  UA_StatusCode retval;
  UA_NodeAttributes *attr_local;
  UA_AddNodesItem *item_local;
  UA_Node *node_local;
  
  UVar1 = UA_NodeId_copy(&(item->requestedNewNodeId).nodeId,&node->nodeId);
  UVar2 = UA_QualifiedName_copy(&item->browseName,&node->browseName);
  UVar3 = UA_LocalizedText_copy(&attr->displayName,&node->displayName);
  UVar4 = UA_LocalizedText_copy(&attr->description,&node->description);
  node->writeMask = attr->writeMask;
  node->userWriteMask = attr->userWriteMask;
  return UVar4 | UVar3 | UVar2 | UVar1;
}

Assistant:

static UA_StatusCode
copyStandardAttributes(UA_Node *node, const UA_AddNodesItem *item,
                       const UA_NodeAttributes *attr) {
    UA_StatusCode retval;
    retval  = UA_NodeId_copy(&item->requestedNewNodeId.nodeId, &node->nodeId);
    retval |= UA_QualifiedName_copy(&item->browseName, &node->browseName);
    retval |= UA_LocalizedText_copy(&attr->displayName, &node->displayName);
    retval |= UA_LocalizedText_copy(&attr->description, &node->description);
    node->writeMask = attr->writeMask;
    node->userWriteMask = attr->userWriteMask;
    return retval;
}